

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::anon_unknown_1::AssertionPrinter::printResultType
          (AssertionPrinter *this,Code colour,string *passOrFail)

{
  ostream *poVar1;
  char local_1b [10];
  Colour colourGuard;
  
  if (passOrFail->_M_string_length != 0) {
    local_1b[2] = 0;
    Colour::use(colour);
    local_1b[1] = 0x20;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)this->stream,local_1b + 1,1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,(passOrFail->_M_dataplus)._M_p,passOrFail->_M_string_length);
    Colour::use(None);
    local_1b[0] = ':';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this->stream,local_1b,1);
  }
  return;
}

Assistant:

void printResultType(Colour::Code colour, std::string const& passOrFail) const {
                if (!passOrFail.empty()) {
                    {
                        Colour colourGuard(colour);
                        stream << ' ' << passOrFail;
                    }
                    stream << ':';
                }
            }